

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall clask::response_writer::set_header(response_writer *this,string *key,string *val)

{
  size_type sVar1;
  pointer pcVar2;
  pointer ppVar3;
  _Alloc_hider __s2;
  int iVar4;
  size_type sVar5;
  pointer ppVar6;
  string h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar1 = key->_M_string_length;
  if (sVar1 != 0) {
    sVar5 = 0;
    do {
      pcVar2 = (key->_M_dataplus)._M_p;
      if (((sVar5 == 0) || (pcVar2[sVar5 - 1] == '-')) || (pcVar2[sVar5 - 1] == ' ')) {
        iVar4 = toupper((int)pcVar2[sVar5]);
        pcVar2[sVar5] = (char)iVar4;
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)key);
  __s2._M_p = local_50._M_dataplus._M_p;
  ppVar6 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar6 == ppVar3) {
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string&,std::__cxx11::string_const&>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->headers,&local_50,val);
LAB_0010b078:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    if (((ppVar6->first)._M_string_length == local_50._M_string_length) &&
       ((local_50._M_string_length == 0 ||
        (iVar4 = bcmp((ppVar6->first)._M_dataplus._M_p,__s2._M_p,local_50._M_string_length),
        iVar4 == 0)))) {
      std::__cxx11::string::_M_assign((string *)&ppVar6->second);
      goto LAB_0010b078;
    }
    ppVar6 = ppVar6 + 1;
  } while( true );
}

Assistant:

inline void response_writer::set_header(std::string key, const std::string& val) {
  auto h = camelize(key);
  for (auto& hh : headers) {
    if (hh.first == h) {
      hh.second = val;
      return;
    }
  }
  headers.emplace_back(h, val);
}